

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O0

void sinfl_build(uint *tbl,uchar *lens,int tbl_bits,int maxlen,int symcnt)

{
  int iVar1;
  int iVar2;
  undefined1 local_310 [8];
  sinfl_gen gen;
  int off [16];
  int cnt [16];
  short sort [288];
  int local_2c;
  int local_28;
  int used;
  int i;
  int symcnt_local;
  int maxlen_local;
  int tbl_bits_local;
  uchar *lens_local;
  uint *tbl_local;
  
  local_2c = 0;
  memset(off + 0xe,0,0x40);
  memset(&gen.sorted,0,0x40);
  memset(local_310,0,0x18);
  local_310._0_4_ = 1;
  for (local_28 = 0; local_28 < symcnt; local_28 = local_28 + 1) {
    off[(ulong)lens[local_28] + 0xe] = off[(ulong)lens[local_28] + 0xe] + 1;
  }
  gen.sorted._4_4_ = off[0xe];
  for (local_28 = 1; local_28 < maxlen; local_28 = local_28 + 1) {
    off[(long)(local_28 + 1) + -2] = off[(long)local_28 + -2] + off[(long)local_28 + 0xe];
    local_2c = local_2c * 2 + off[(long)local_28 + 0xe];
  }
  iVar2 = off[(long)local_28 + 0xe];
  for (local_28 = 0; local_28 < symcnt; local_28 = local_28 + 1) {
    iVar1 = off[(ulong)lens[local_28] - 2];
    off[(ulong)lens[local_28] - 2] = iVar1 + 1;
    sort[(long)iVar1 + -4] = (short)local_28;
  }
  gen._8_8_ = sort + (long)(int)gen.sorted + -4;
  if (local_2c * 2 + iVar2 < 1 << ((byte)maxlen & 0x1f)) {
    for (local_28 = 0; local_28 < 1 << ((byte)tbl_bits & 0x1f); local_28 = local_28 + 1) {
      tbl[local_28] = 1;
    }
  }
  else {
    iVar2 = sinfl_build_tbl((sinfl_gen *)local_310,tbl,tbl_bits,off + 0xe);
    if (iVar2 == 0) {
      sinfl_build_subtbl((sinfl_gen *)local_310,tbl,tbl_bits,off + 0xe);
    }
  }
  return;
}

Assistant:

static void
sinfl_build(unsigned *tbl, unsigned char *lens, int tbl_bits, int maxlen,
            int symcnt) {
  int i, used = 0;
  short sort[288];
  int cnt[16] = {0}, off[16]= {0};
  struct sinfl_gen gen = {0};
  gen.sorted = sort;
  gen.len = 1;

  for (i = 0; i < symcnt; ++i)
    cnt[lens[i]]++;
  off[1] = cnt[0];
  for (i = 1; i < maxlen; ++i) {
    off[i + 1] = off[i] + cnt[i];
    used = (used << 1) + cnt[i];
  }
  used = (used << 1) + cnt[i];
  for (i = 0; i < symcnt; ++i)
    gen.sorted[off[lens[i]]++] = (short)i;
  gen.sorted += off[0];

  if (used < (1 << maxlen)){
    for (i = 0; i < 1 << tbl_bits; ++i)
      tbl[i] = (0 << 16u) | 1;
    return;
  }
  if (!sinfl_build_tbl(&gen, tbl, tbl_bits, cnt)){
    sinfl_build_subtbl(&gen, tbl, tbl_bits, cnt);
  }
}